

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O2

void pbrt::CheckCallbackScope::Fail(void)

{
  __normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>_>
  __tmp;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()> *this
  ;
  string message;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  PrintStackTrace();
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  this = DAT_0302e698;
  while (this != callbacks_abi_cxx11_) {
    this = this + -1;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_38,this);
    std::__cxx11::string::append((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  fprintf(_stderr,"%s\n\n",local_58);
  abort();
}

Assistant:

void CheckCallbackScope::Fail() {
    PrintStackTrace();

    std::string message;
    for (auto iter = callbacks.rbegin(); iter != callbacks.rend(); ++iter)
        message += (*iter)();
    fprintf(stderr, "%s\n\n", message.c_str());

#if defined(_DEBUG) && defined(_MSC_VER)
    // When debugging on windows, avoid the obnoxious dialog and make
    // it possible to continue past a LOG(FATAL) in the debugger
    __debugbreak();
#else
    abort();
#endif
}